

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow_conflict *window,int n)

{
  ImGuiID IVar1;
  int n_local;
  
  if ((uint)n < 4) {
    if ((window->field_0x3e1 & 1) != 0) {
      window = window->DockNode->HostWindow;
    }
    IVar1 = ImHashStr("#RESIZE",0,window->ID);
    IVar1 = ImHashData(&n_local,4,IVar1);
    return IVar1;
  }
  __assert_fail("n >= 0 && n < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1642,"ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow *, int)");
}

Assistant:

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n < 4);
    ImGuiID id = window->DockIsActive ? window->DockNode->HostWindow->ID : window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}